

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O1

void __thiscall RoughPlasticBSDF::RoughPlasticBSDF(RoughPlasticBSDF *this,Json *conf)

{
  float fVar1;
  const_reference pvVar2;
  long lVar3;
  undefined **ppuVar4;
  int iVar5;
  float fVar6;
  undefined8 uVar7;
  double dVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  MT19937Sampler sampler;
  undefined **local_13b0 [625];
  undefined8 local_28;
  
  BSDF::BSDF(&this->super_BSDF,conf);
  (this->super_BSDF)._vptr_BSDF = (_func_int **)&PTR_f_0016cb48;
  (this->Ks).x = 1.0;
  (this->Ks).y = 1.0;
  (this->Ks).z = 1.0;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"ior");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar2,(float *)local_13b0);
  *(float *)&(this->super_BSDF).field_0x24 = local_13b0[0]._0_4_;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"roughness");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar2,(float *)local_13b0);
  this->alpha = local_13b0[0]._0_4_;
  local_13b0[0] = &PTR_get1f_0016bb78;
  local_13b0[1] = (undefined **)0x0;
  lVar3 = 2;
  ppuVar4 = (undefined **)0x0;
  do {
    ppuVar4 = (undefined **)
              (ulong)((((uint)((ulong)ppuVar4 >> 0x1e) ^ (uint)ppuVar4) * 0x6c078965 + (int)lVar3) -
                     1);
    local_13b0[lVar3] = ppuVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x271);
  local_28 = 0x270;
  iVar5 = 1000000;
  fVar1 = 0.0;
  do {
    uVar7 = (*(code *)local_13b0[0][5])(local_13b0);
    fVar9 = (float)((ulong)uVar7 >> 0x20);
    dVar8 = (double)((1.0 - (float)uVar7 * (float)uVar7) - fVar9 * fVar9);
    if (dVar8 <= 0.0) {
      dVar8 = 0.0;
    }
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    fVar6 = (float)dVar8;
    fVar11 = 1.0 / *(float *)&(this->super_BSDF).field_0x24;
    fVar9 = 1.0 - fVar6 * fVar6;
    if (fVar9 <= 0.0) {
      fVar9 = 0.0;
    }
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    fVar9 = fVar9 / fVar11;
    fVar10 = 1.0;
    if (fVar9 < 1.0) {
      fVar9 = 1.0 - fVar9 * fVar9;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      fVar10 = (fVar11 * fVar6 - fVar9) / (fVar11 * fVar6 + fVar9);
      fVar9 = (fVar6 - fVar11 * fVar9) / (fVar11 * fVar9 + fVar6);
      fVar10 = (fVar9 * fVar9 + fVar10 * fVar10) * 0.5;
    }
    fVar1 = fVar1 + (1.0 - fVar10);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  this->outRatio = fVar1 / 1e+06;
  return;
}

Assistant:

RoughPlasticBSDF(const Json& conf): BSDF(conf)
	{
		IOR = conf["ior"];
		alpha = conf["roughness"];
		// precompute outRatio
		// here bruteforcing to demonstrate its physical meaning
		// you can optimize by using approximating polynormial
		MT19937Sampler sampler;
		const int nsample = 1000000;
		double energy = 0; // use double here because accumulating process introduces lots of rounding error
		for (int i=0; i<nsample; ++i) {
			vec3f lambert_out = sampler.cosSampleHemisphereSurface();
			energy += 1 - DielectricBRDF::reflectivity(lambert_out.z, 1/IOR);
		}
		outRatio = energy / nsample;
	}